

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  Counts *in_RSI;
  long in_RDI;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  columns;
  undefined4 in_stack_fffffffffffffa88;
  Code in_stack_fffffffffffffa8c;
  SummaryColumn *in_stack_fffffffffffffa90;
  allocator *paVar4;
  string *in_stack_fffffffffffffa98;
  SummaryColumn *in_stack_fffffffffffffaa0;
  SummaryColumn *this_00;
  size_t in_stack_fffffffffffffb08;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  *in_stack_fffffffffffffb10;
  Colour *pCVar5;
  string *in_stack_fffffffffffffb18;
  ConsoleReporter *in_stack_fffffffffffffb20;
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  undefined1 local_479 [232];
  allocator local_391;
  string local_390 [64];
  size_t in_stack_fffffffffffffcb0;
  SummaryColumn *in_stack_fffffffffffffcb8;
  allocator local_2a9;
  string local_2a8 [231];
  allocator local_1c1;
  string local_1c0 [255];
  allocator local_c1;
  string local_c0 [79];
  allocator local_71;
  string local_70 [75];
  Colour local_25 [20];
  Colour local_11;
  Counts *local_10;
  
  local_10 = in_RSI;
  sVar2 = Counts::total(in_RSI + 1);
  if (sVar2 == 0) {
    poVar3 = *(ostream **)(in_RDI + 0x18);
    pCVar5 = &local_11;
    Colour::Colour((Colour *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
    poVar3 = Catch::operator<<(poVar3,pCVar5);
    std::operator<<(poVar3,"No tests ran\n");
    Colour::~Colour((Colour *)0x1eb1c3);
  }
  else {
    sVar2 = Counts::total(local_10);
    if ((sVar2 == 0) || (bVar1 = Counts::allPassed(local_10), !bVar1)) {
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::vector((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)0x1eb522);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"",&local_1c1);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      Counts::total(local_10 + 1);
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      Counts::total(local_10);
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::push_back((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                   *)in_stack_fffffffffffffa90,
                  (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"passed",&local_2a9);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::push_back((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                   *)in_stack_fffffffffffffa90,
                  (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"failed",&local_391);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::push_back((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                   *)in_stack_fffffffffffffa90,
                  (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      this_00 = (SummaryColumn *)local_479;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_479 + 1),"failed as expected",(allocator *)this_00);
      SummaryColumn::SummaryColumn
                (this_00,in_stack_fffffffffffffa98,(Code)((ulong)in_stack_fffffffffffffa90 >> 0x20))
      ;
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      SummaryColumn::addRow(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::push_back((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                   *)in_stack_fffffffffffffa90,
                  (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string((string *)(local_479 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_479);
      paVar4 = &local_4a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,"test cases",paVar4);
      printSummaryRow(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                      in_stack_fffffffffffffb08);
      std::__cxx11::string::~string(local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      paVar4 = &local_4c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,"assertions",paVar4);
      printSummaryRow(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                      in_stack_fffffffffffffb08);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      std::
      vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
      ::~vector((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                 *)this_00);
    }
    else {
      poVar3 = *(ostream **)(in_RDI + 0x18);
      pCVar5 = local_25;
      Colour::Colour((Colour *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
      poVar3 = Catch::operator<<(poVar3,pCVar5);
      std::operator<<(poVar3,"All tests passed");
      Colour::~Colour((Colour *)0x1eb27c);
      std::operator<<(*(ostream **)(in_RDI + 0x18)," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"assertion",&local_71);
      pluralise::pluralise
                ((pluralise *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(string *)0x1eb2f0);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffa90,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::operator<<(poVar3," in ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"test case",&local_c1);
      pluralise::pluralise
                ((pluralise *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(string *)0x1eb37b);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffa90,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      poVar3 = std::operator<<(poVar3,")");
      std::operator<<(poVar3,"\n");
      pluralise::~pluralise((pluralise *)0x1eb3ce);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      pluralise::~pluralise((pluralise *)0x1eb3f5);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  return;
}

Assistant:

void printTotals( Totals const& totals ) {
            if( totals.testCases.total() == 0 ) {
                stream << Colour( Colour::Warning ) << "No tests ran\n";
            }
            else if( totals.assertions.total() > 0 && totals.assertions.allPassed() ) {
                stream << Colour( Colour::ResultSuccess ) << "All tests passed";
                stream << " ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")"
                        << "\n";
            }
            else {

                std::vector<SummaryColumn> columns;
                columns.push_back( SummaryColumn( "", Colour::None )
                                        .addRow( totals.testCases.total() )
                                        .addRow( totals.assertions.total() ) );
                columns.push_back( SummaryColumn( "passed", Colour::Success )
                                        .addRow( totals.testCases.passed )
                                        .addRow( totals.assertions.passed ) );
                columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                                        .addRow( totals.testCases.failed )
                                        .addRow( totals.assertions.failed ) );
                columns.push_back( SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                                        .addRow( totals.testCases.failedButOk )
                                        .addRow( totals.assertions.failedButOk ) );

                printSummaryRow( "test cases", columns, 0 );
                printSummaryRow( "assertions", columns, 1 );
            }
        }